

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::FeatureSet::ByteSizeLong(FeatureSet *this)

{
  uint uVar1;
  FeatureSet_FieldPresence value;
  FeatureSet_EnumType value_00;
  FeatureSet_RepeatedFieldEncoding value_01;
  FeatureSet_Utf8Validation value_02;
  FeatureSet_MessageEncoding value_03;
  FeatureSet_JsonFormat value_04;
  FeatureSet_EnforceNamingStyle value_05;
  FeatureSet_VisibilityFeature_DefaultSymbolVisibility value_06;
  uint32_t *puVar2;
  size_t sVar3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  FeatureSet *this_;
  FeatureSet *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar2 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar2;
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      value = _internal_field_presence(this);
      sVar3 = internal::WireFormatLite::EnumSize(value);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      value_00 = _internal_enum_type(this);
      sVar3 = internal::WireFormatLite::EnumSize(value_00);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      value_01 = _internal_repeated_field_encoding(this);
      sVar3 = internal::WireFormatLite::EnumSize(value_01);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      value_02 = _internal_utf8_validation(this);
      sVar3 = internal::WireFormatLite::EnumSize(value_02);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 0x10) != 0) {
      value_03 = _internal_message_encoding(this);
      sVar3 = internal::WireFormatLite::EnumSize(value_03);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 0x20) != 0) {
      value_04 = _internal_json_format(this);
      sVar3 = internal::WireFormatLite::EnumSize(value_04);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 0x40) != 0) {
      value_05 = _internal_enforce_naming_style(this);
      sVar3 = internal::WireFormatLite::EnumSize(value_05);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
    if ((uVar1 & 0x80) != 0) {
      value_06 = _internal_default_symbol_visibility(this);
      sVar3 = internal::WireFormatLite::EnumSize(value_06);
      sStack_58 = sVar3 + 1 + sStack_58;
    }
  }
  sVar3 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t FeatureSet::ByteSizeLong() const {
  const FeatureSet& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FeatureSet)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // optional .google.protobuf.FeatureSet.FieldPresence field_presence = 1 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_FILE, edition_defaults = {
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_field_presence());
    }
    // optional .google.protobuf.FeatureSet.EnumType enum_type = 2 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_ENUM, targets = TARGET_TYPE_FILE, edition_defaults = {
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_enum_type());
    }
    // optional .google.protobuf.FeatureSet.RepeatedFieldEncoding repeated_field_encoding = 3 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_FILE, edition_defaults = {
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_field_encoding());
    }
    // optional .google.protobuf.FeatureSet.Utf8Validation utf8_validation = 4 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_FILE, edition_defaults = {
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_utf8_validation());
    }
    // optional .google.protobuf.FeatureSet.MessageEncoding message_encoding = 5 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_FILE, edition_defaults = {
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_message_encoding());
    }
    // optional .google.protobuf.FeatureSet.JsonFormat json_format = 6 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_MESSAGE, targets = TARGET_TYPE_ENUM, targets = TARGET_TYPE_FILE, edition_defaults = {
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_json_format());
    }
    // optional .google.protobuf.FeatureSet.EnforceNamingStyle enforce_naming_style = 7 [retention = RETENTION_SOURCE, targets = TARGET_TYPE_FILE, targets = TARGET_TYPE_EXTENSION_RANGE, targets = TARGET_TYPE_MESSAGE, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_ONEOF, targets = TARGET_TYPE_ENUM, targets = TARGET_TYPE_ENUM_ENTRY, targets = TARGET_TYPE_SERVICE, targets = TARGET_TYPE_METHOD, edition_defaults = {
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_enforce_naming_style());
    }
    // optional .google.protobuf.FeatureSet.VisibilityFeature.DefaultSymbolVisibility default_symbol_visibility = 8 [retention = RETENTION_SOURCE, targets = TARGET_TYPE_FILE, edition_defaults = {
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_default_symbol_visibility());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}